

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

tmbstr MergeProperties(TidyDocImpl *doc,ctmbstr s1,ctmbstr s2)

{
  StyleProp **ppSVar1;
  char cVar2;
  uint uVar3;
  StyleProp *pSVar4;
  StyleProp *pSVar5;
  tmbstr ptVar6;
  tmbstr ptVar7;
  tmbstr ptVar8;
  char *pcVar9;
  int iVar10;
  
  iVar10 = 0;
  pSVar4 = CreateProps(doc,(StyleProp *)0x0,s1);
  pSVar5 = CreateProps(doc,pSVar4,s2);
  pSVar4 = pSVar5;
  if (pSVar5 == (StyleProp *)0x0) {
    iVar10 = 1;
  }
  else {
    do {
      uVar3 = prvTidytmbstrlen(pSVar4->name);
      iVar10 = iVar10 + uVar3 + 2;
      if (pSVar4->value != (ctmbstr)0x0) {
        uVar3 = prvTidytmbstrlen(pSVar4->value);
        iVar10 = iVar10 + uVar3 + 2;
      }
      ppSVar1 = &pSVar4->next;
      pSVar4 = *ppSVar1;
    } while (*ppSVar1 != (StyleProp *)0x0);
    iVar10 = iVar10 + 1;
  }
  ptVar6 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,(size_t)iVar10);
  *ptVar6 = '\0';
  pSVar4 = pSVar5;
  ptVar8 = ptVar6;
  if (pSVar5 != (StyleProp *)0x0) {
    do {
      pcVar9 = pSVar4->name;
      ptVar7 = ptVar8 + -1;
      do {
        ptVar8 = ptVar8 + 1;
        cVar2 = *pcVar9;
        pcVar9 = pcVar9 + 1;
        ptVar7[1] = cVar2;
        ptVar7 = ptVar7 + 1;
      } while (cVar2 != '\0');
      if (pSVar4->value != (tmbstr)0x0) {
        ptVar7[0] = ':';
        ptVar7[1] = ' ';
        pcVar9 = pSVar4->value;
        do {
          cVar2 = *pcVar9;
          pcVar9 = pcVar9 + 1;
          ptVar8[1] = cVar2;
          ptVar8 = ptVar8 + 1;
          ptVar7 = ptVar8;
        } while (cVar2 != '\0');
      }
      if (pSVar4->next == (StyleProp *)0x0) break;
      ptVar7[0] = ';';
      ptVar7[1] = ' ';
      ppSVar1 = &pSVar4->next;
      pSVar4 = *ppSVar1;
      ptVar8 = ptVar7 + 2;
    } while (*ppSVar1 != (StyleProp *)0x0);
    do {
      pSVar4 = pSVar5->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pSVar5->name);
      (*doc->allocator->vtbl->free)(doc->allocator,pSVar5->value);
      (*doc->allocator->vtbl->free)(doc->allocator,pSVar5);
      pSVar5 = pSVar4;
    } while (pSVar4 != (StyleProp *)0x0);
  }
  return ptVar6;
}

Assistant:

static tmbstr MergeProperties( TidyDocImpl* doc, ctmbstr s1, ctmbstr s2 )
{
    tmbstr s;
    StyleProp *prop;

    prop = CreateProps(doc, NULL, s1);
    prop = CreateProps(doc, prop, s2);
    s = CreatePropString(doc, prop);
    FreeStyleProps(doc, prop);
    return s;
}